

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ClockingItemSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ClockingItemSyntax,slang::syntax::ClockingItemSyntax_const&>
          (BumpAllocator *this,ClockingItemSyntax *args)

{
  ClockingItemSyntax *this_00;
  
  this_00 = (ClockingItemSyntax *)allocate(this,0xa0,8);
  slang::syntax::ClockingItemSyntax::ClockingItemSyntax(this_00,args);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }